

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O2

size_t singleOptionUsage(FILE *fp,columns_t columns,poptOption *opt,char *translation_domain)

{
  uint uVar1;
  int __c;
  char *__s;
  ushort **ppuVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  long lVar9;
  
  __s = getArgDescrip(opt,(char *)columns);
  ppuVar2 = __ctype_b_loc();
  pcVar7 = opt->longName;
  bVar8 = (*(byte *)((long)*ppuVar2 + (long)opt->shortName * 2 + 1) & 0x40) >> 6 &
          (long)opt->shortName != 0x20;
  if (bVar8 == 0) {
    if (pcVar7 == (char *)0x0) {
      return columns->cur;
    }
    lVar9 = 3;
  }
  else {
    lVar9 = 5;
    if (pcVar7 == (char *)0x0) goto LAB_00106d12;
  }
  uVar1 = opt->argInfo;
  sVar3 = strlen(pcVar7);
  lVar9 = (ulong)(-1 < (int)uVar1) + sVar3 + lVar9 + (ulong)bVar8 + 1;
LAB_00106d12:
  if (__s != (char *)0x0) {
    pvVar4 = memchr(" =(",(int)*__s,4);
    sVar5 = stringDisplayWidth((char *)fp);
    lVar9 = lVar9 + sVar5 + (ulong)(pvVar4 == (void *)0x0);
  }
  if (columns->max < columns->cur + lVar9) {
    fwrite("\n       ",8,1,(FILE *)fp);
    columns->cur = 7;
  }
  fwrite(" [",2,1,(FILE *)fp);
  if (bVar8 != 0) {
    fprintf((FILE *)fp,"-%c",(ulong)(uint)(int)opt->shortName);
  }
  if (opt->longName != (char *)0x0) {
    pcVar7 = "";
    if (bVar8 != 0) {
      pcVar7 = "|";
    }
    pcVar6 = "-";
    if (-1 < (int)opt->argInfo) {
      pcVar6 = "--";
    }
    fprintf((FILE *)fp,"%s%s%s",pcVar7,pcVar6);
  }
  if (__s != (char *)0x0) {
    pvVar4 = memchr(" =(",(int)*__s,4);
    if (pvVar4 == (void *)0x0) {
      __c = 0x3d;
      if (opt->longName == (char *)0x0) {
        __c = 0x20;
      }
      fputc(__c,(FILE *)fp);
    }
    fputs(__s,(FILE *)fp);
  }
  fputc(0x5d,(FILE *)fp);
  return columns->cur + lVar9 + 1;
}

Assistant:

static size_t singleOptionUsage(FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char *translation_domain)
{
    size_t len = sizeof(" []")-1;
    const char * argDescrip = getArgDescrip(opt, translation_domain);
    /* Display shortName iff printable non-space. */
    int prtshort = (int)(isprint((int)opt->shortName) && opt->shortName != ' ');

#define	prtlong	(opt->longName != NULL)	/* XXX splint needs a clue */
    if (!(prtshort || prtlong))
	return columns->cur;

    len = sizeof(" []")-1;
    if (prtshort)
	len += sizeof("-c")-1;
    if (prtlong) {
	if (prtshort) len += sizeof("|")-1;
	len += (F_ISSET(opt, ONEDASH) ? sizeof("-") : sizeof("--")) - 1;
	len += strlen(opt->longName);
    }

    if (argDescrip) {

	/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	if (!strchr(" =(", argDescrip[0])) len += sizeof("=")-1;

	/* Adjust for (possible) wide characters. */
	len += stringDisplayWidth(argDescrip);
    }

    if ((columns->cur + len) > columns->max) {
	fprintf(fp, "\n       ");
	columns->cur = (size_t)7;
    } 

    fprintf(fp, " [");
    if (prtshort)
	fprintf(fp, "-%c", opt->shortName);
    if (prtlong)
	fprintf(fp, "%s%s%s",
		(prtshort ? "|" : ""),
		(F_ISSET(opt, ONEDASH) ? "-" : "--"),
		opt->longName);
#undef	prtlong

    if (argDescrip) {
	/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	if (!strchr(" =(", argDescrip[0])) fputc(opt->longName == NULL ? ' ' : '=', fp);
	fprintf(fp, "%s", argDescrip);
    }
    fprintf(fp, "]");

    return columns->cur + len + 1;
}